

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void readliteral_cc(BinarySource *bs,termchar *c,termline *ldata,unsigned_long *state)

{
  termchar *ptVar1;
  termline *ldata_00;
  termline *extraout_RDX;
  unsigned_long zstate;
  termchar n;
  unsigned_long local_50;
  termchar local_48;
  
  ptVar1 = ldata->chars;
  c->cc_next = L'\0';
  ldata_00 = ldata;
  while( true ) {
    local_50 = 0;
    readliteral_chr(bs,&local_48,ldata_00,&local_50);
    if (local_48.chr == 0) break;
    add_cc(ldata,(wchar_t)((ulong)((long)c - (long)ptVar1) >> 5),local_48.chr);
    ldata_00 = extraout_RDX;
  }
  return;
}

Assistant:

static void readliteral_cc(BinarySource *bs, termchar *c, termline *ldata,
                           unsigned long *state)
{
    termchar n;
    unsigned long zstate;
    int x = c - ldata->chars;

    c->cc_next = 0;

    while (1) {
        zstate = 0;
        readliteral_chr(bs, &n, ldata, &zstate);
        if (!n.chr)
            break;
        add_cc(ldata, x, n.chr);
    }
}